

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsCurveGeometry.h
# Opt level: O1

vector<long,_std::allocator<long>_> * __thiscall
anurbs::NurbsCurveGeometry<2L>::nonzero_pole_indices_at_span
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,NurbsCurveGeometry<2L> *this,
          Index span)

{
  pointer plVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar3;
  long lVar4;
  allocator_type local_19;
  
  iVar2 = (*(this->super_CurveBase<2L>)._vptr_CurveBase[2])(this);
  std::vector<long,_std::allocator<long>_>::vector
            (__return_storage_ptr__,CONCAT44(extraout_var,iVar2) + 1,&local_19);
  iVar2 = (*(this->super_CurveBase<2L>)._vptr_CurveBase[2])(this);
  plVar1 = (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)(__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)plVar1 >> 3;
  if (0 < lVar4) {
    lVar3 = 0;
    do {
      plVar1[lVar3] = (span - CONCAT44(extraout_var_00,iVar2)) + 1 + lVar3;
      lVar3 = lVar3 + 1;
    } while (lVar4 != lVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Index> nonzero_pole_indices_at_span(const Index span) const
    {
        std::vector<Index> result(degree() + 1);

        const Index first_nonzero_pole_index = span - degree() + 1;

        for (Index i = 0; i < length(result); i++) {
            result[i] = first_nonzero_pole_index + i;
        }

        return result;
    }